

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O1

void compact_int8_suite::test_array8_int8_empty(void)

{
  value *pvVar1;
  value vVar2;
  value_type input [2];
  decoder decoder;
  value local_5c [2];
  uchar local_52 [2];
  decoder local_50;
  
  local_50.input._M_str = local_52;
  local_52[0] = 0xa8;
  local_52[1] = '\0';
  local_50.input._M_len = 2;
  local_50.current.view._M_len = 0;
  local_50.current.view._M_str = (uchar *)0x0;
  local_50.current.code = end;
  trial::protocol::bintoken::detail::decoder::next(&local_50);
  local_5c[0] = local_50.current.code;
  pvVar1 = local_5c + 1;
  local_5c[1] = 0xa8;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::array8_int8",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x555,"void compact_int8_suite::test_array8_int8_empty()",local_5c,pvVar1);
  local_5c[0] = trial::protocol::bintoken::token::symbol::convert(local_50.current.code);
  local_5c[1] = 7;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("decoder.symbol()","token::symbol::array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x556,"void compact_int8_suite::test_array8_int8_empty()",local_5c,pvVar1);
  vVar2 = trial::protocol::bintoken::token::symbol::convert(local_50.current.code);
  local_5c[0] = end;
  if (vVar2 - null < 0xc) {
    local_5c[0] = *(value *)(&DAT_00124a00 + (ulong)(vVar2 - null) * 4);
  }
  local_5c[1] = 2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("decoder.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x557,"void compact_int8_suite::test_array8_int8_empty()",local_5c,pvVar1);
  boost::detail::test_impl
            ("decoder.literal().empty()",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x558,"void compact_int8_suite::test_array8_int8_empty()",
             local_50.current.view._M_len == 0);
  trial::protocol::bintoken::detail::decoder::next(&local_50);
  local_5c[0] = local_50.current.code;
  local_5c[1] = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x55a,"void compact_int8_suite::test_array8_int8_empty()",local_5c,pvVar1);
  return;
}

Assistant:

void test_array8_int8_empty()
{
    const value_type input[] = { token::code::array8_int8, 0x00 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::array8_int8);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.symbol(), token::symbol::array);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.category(), token::category::data);
    TRIAL_PROTOCOL_TEST(decoder.literal().empty());
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}